

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O0

void Assimp::IFC::ProcessParametrizedProfile
               (IfcParameterizedProfileDef *def,TempMesh *meshout,ConversionData *conv)

{
  ConversionData *pCVar1;
  size_type sVar2;
  IfcAxis2Placement2D *in;
  double dVar3;
  double dVar4;
  float local_4a4;
  undefined1 local_478 [8];
  IfcMatrix4 trafo;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  format local_3a8;
  value_type_conflict4 local_22c;
  aiVector3t<double> local_228;
  aiVector3t<double> local_210;
  aiVector3t<double> local_1f8;
  aiVector3t<double> local_1e0;
  aiVector3t<double> local_1c8;
  aiVector3t<double> local_1b0;
  aiVector3t<double> local_198;
  aiVector3t<double> local_180;
  aiVector3t<double> local_168;
  aiVector3t<double> local_150;
  aiVector3t<double> local_138;
  aiVector3t<double> local_120;
  double local_108;
  IfcFloat inner_height;
  IfcFloat offset;
  IfcIShapeProfileDef *ishape;
  aiVector3t<double> local_e8;
  IfcFloat local_d0;
  size_t i;
  IfcFloat angle;
  IfcFloat radius;
  IfcFloat delta;
  size_t segments;
  IfcCircleProfileDef *circle;
  aiVector3t<double> local_98;
  aiVector3t<double> local_80;
  aiVector3t<double> local_68;
  aiVector3t<double> local_50;
  double local_38;
  IfcFloat y;
  IfcFloat x;
  IfcRectangleProfileDef *cprofile;
  ConversionData *conv_local;
  TempMesh *meshout_local;
  IfcParameterizedProfileDef *def_local;
  
  cprofile = (IfcRectangleProfileDef *)conv;
  conv_local = (ConversionData *)meshout;
  meshout_local = (TempMesh *)def;
  x = (IfcFloat)
      STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcRectangleProfileDef>
                ((Object *)
                 ((long)&(def->super_IfcProfileDef).
                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                         _vptr_ObjectHelper +
                 (long)(def->super_IfcProfileDef).
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                       _vptr_ObjectHelper[-3]));
  pCVar1 = conv_local;
  if ((IfcRectangleProfileDef *)x == (IfcRectangleProfileDef *)0x0) {
    segments = (size_t)STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcCircleProfileDef>
                                 ((Object *)
                                  ((long)&(meshout_local->mVerts).
                                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (long)(meshout_local->mVerts).
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].x));
    if ((IfcCircleProfileDef *)segments == (IfcCircleProfileDef *)0x0) {
      offset = (IfcFloat)
               STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcIShapeProfileDef>
                         ((Object *)
                          ((long)&(meshout_local->mVerts).
                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                          (long)(meshout_local->mVerts).
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].x));
      if ((IfcIShapeProfileDef *)offset == (IfcIShapeProfileDef *)0x0) {
        STEP::Object::GetClassName_abi_cxx11_
                  (&local_3e8,
                   (Object *)
                   ((long)&(meshout_local->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                   (long)(meshout_local->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].x));
        std::operator+(&local_3c8,"skipping unknown IfcParameterizedProfileDef entity, type is ",
                       &local_3e8);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_3a8,
                   &local_3c8);
        LogFunctions<Assimp::IFCImporter>::LogWarn(&local_3a8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_3a8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_3e8);
        return;
      }
      inner_height = (*(double *)
                       &(((IfcIShapeProfileDef *)offset)->super_IfcParameterizedProfileDef).
                        field_0x80 - ((IfcIShapeProfileDef *)offset)->WebThickness) / 2.0;
      local_108 = -((IfcIShapeProfileDef *)offset)->FlangeThickness +
                  -((IfcIShapeProfileDef *)offset)->FlangeThickness +
                  ((IfcIShapeProfileDef *)offset)->OverallDepth;
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)conv_local,0xc)
      ;
      pCVar1 = conv_local;
      aiVector3t<double>::aiVector3t(&local_120,0.0,0.0,0.0);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                 &local_120);
      pCVar1 = conv_local;
      aiVector3t<double>::aiVector3t(&local_138,0.0,*(double *)((long)offset + 0x98),0.0);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                 &local_138);
      pCVar1 = conv_local;
      aiVector3t<double>::aiVector3t(&local_150,inner_height,*(double *)((long)offset + 0x98),0.0);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                 &local_150);
      pCVar1 = conv_local;
      aiVector3t<double>::aiVector3t
                (&local_168,inner_height,*(double *)((long)offset + 0x98) + local_108,0.0);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                 &local_168);
      pCVar1 = conv_local;
      aiVector3t<double>::aiVector3t
                (&local_180,0.0,*(double *)((long)offset + 0x98) + local_108,0.0);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                 &local_180);
      pCVar1 = conv_local;
      aiVector3t<double>::aiVector3t(&local_198,0.0,*(double *)((long)offset + 0x88),0.0);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                 &local_198);
      pCVar1 = conv_local;
      aiVector3t<double>::aiVector3t
                (&local_1b0,*(double *)((long)offset + 0x80),*(double *)((long)offset + 0x88),0.0);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                 &local_1b0);
      pCVar1 = conv_local;
      aiVector3t<double>::aiVector3t
                (&local_1c8,*(double *)((long)offset + 0x80),
                 *(double *)((long)offset + 0x98) + local_108,0.0);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                 &local_1c8);
      pCVar1 = conv_local;
      aiVector3t<double>::aiVector3t
                (&local_1e0,inner_height + *(double *)((long)offset + 0x90),
                 *(double *)((long)offset + 0x98) + local_108,0.0);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                 &local_1e0);
      pCVar1 = conv_local;
      aiVector3t<double>::aiVector3t
                (&local_1f8,inner_height + *(double *)((long)offset + 0x90),
                 *(double *)((long)offset + 0x98),0.0);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                 &local_1f8);
      pCVar1 = conv_local;
      aiVector3t<double>::aiVector3t
                (&local_210,*(double *)((long)offset + 0x80),*(double *)((long)offset + 0x98),0.0);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                 &local_210);
      pCVar1 = conv_local;
      aiVector3t<double>::aiVector3t(&local_228,*(double *)((long)offset + 0x80),0.0,0.0);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                 &local_228);
      local_22c = 0xc;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&conv_local->db,&local_22c);
    }
    else {
      STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcCircleHollowProfileDef>
                ((Object *)
                 ((long)&(meshout_local->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                 (long)(meshout_local->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[-1].x));
      delta = (IfcFloat)(long)*(int *)(*(long *)&cprofile[1].field_0x98 + 8);
      local_4a4 = (float)(ulong)delta;
      radius = (IfcFloat)(6.2831855 / local_4a4);
      angle = *(IfcFloat *)(segments + 0x80);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)conv_local,
                 (size_type)delta);
      i = 0;
      for (local_d0 = 0.0; pCVar1 = conv_local, (ulong)local_d0 < (ulong)delta;
          local_d0 = (IfcFloat)((long)local_d0 + 1)) {
        dVar3 = cos((double)i);
        dVar3 = dVar3 * angle;
        dVar4 = ::sin((double)i);
        aiVector3t<double>::aiVector3t(&local_e8,dVar3,dVar4 * angle,0.0);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,
                   &local_e8);
        i = (size_t)(radius + (double)i);
      }
      ishape._4_4_ = SUB84(delta,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&conv_local->db,
                 (value_type_conflict4 *)((long)&ishape + 4));
    }
  }
  else {
    y = *(double *)&(((IfcRectangleProfileDef *)x)->super_IfcParameterizedProfileDef).field_0x80 *
        0.5;
    local_38 = ((IfcRectangleProfileDef *)x)->YDim * 0.5;
    sVar2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                      ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                       conv_local);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,sVar2 + 4)
    ;
    pCVar1 = conv_local;
    aiVector3t<double>::aiVector3t(&local_50,y,local_38,0.0);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,&local_50)
    ;
    pCVar1 = conv_local;
    aiVector3t<double>::aiVector3t(&local_68,-y,local_38,0.0);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,&local_68)
    ;
    pCVar1 = conv_local;
    aiVector3t<double>::aiVector3t(&local_80,-y,-local_38,0.0);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,&local_80)
    ;
    pCVar1 = conv_local;
    aiVector3t<double>::aiVector3t(&local_98,y,-local_38,0.0);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)pCVar1,&local_98)
    ;
    circle._4_4_ = 4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&conv_local->db,
               (value_type_conflict4 *)((long)&circle + 4));
  }
  aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)local_478);
  in = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement2D>::operator*
                 ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement2D> *)
                  &meshout_local[2].mVerts.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
  ConvertAxisPlacement((IfcMatrix4 *)local_478,in);
  TempMesh::Transform((TempMesh *)conv_local,(IfcMatrix4 *)local_478);
  return;
}

Assistant:

void ProcessParametrizedProfile(const Schema_2x3::IfcParameterizedProfileDef& def, TempMesh& meshout, ConversionData& conv)
{
    if(const Schema_2x3::IfcRectangleProfileDef* const cprofile = def.ToPtr<Schema_2x3::IfcRectangleProfileDef>()) {
        const IfcFloat x = cprofile->XDim*0.5f, y = cprofile->YDim*0.5f;

        meshout.mVerts.reserve(meshout.mVerts.size()+4);
        meshout.mVerts.push_back( IfcVector3( x, y, 0.f ));
        meshout.mVerts.push_back( IfcVector3(-x, y, 0.f ));
        meshout.mVerts.push_back( IfcVector3(-x,-y, 0.f ));
        meshout.mVerts.push_back( IfcVector3( x,-y, 0.f ));
        meshout.mVertcnt.push_back(4);
    }
    else if( const Schema_2x3::IfcCircleProfileDef* const circle = def.ToPtr<Schema_2x3::IfcCircleProfileDef>()) {
        if(def.ToPtr<Schema_2x3::IfcCircleHollowProfileDef>()) {
            // TODO
        }
        const size_t segments = conv.settings.cylindricalTessellation;
        const IfcFloat delta = AI_MATH_TWO_PI_F/segments, radius = circle->Radius;

        meshout.mVerts.reserve(segments);

        IfcFloat angle = 0.f;
        for(size_t i = 0; i < segments; ++i, angle += delta) {
            meshout.mVerts.push_back( IfcVector3( std::cos(angle)*radius, std::sin(angle)*radius, 0.f ));
        }

        meshout.mVertcnt.push_back(static_cast<unsigned int>(segments));
    }
    else if( const Schema_2x3::IfcIShapeProfileDef* const ishape = def.ToPtr<Schema_2x3::IfcIShapeProfileDef>()) {
        // construct simplified IBeam shape
        const IfcFloat offset = (ishape->OverallWidth - ishape->WebThickness) / 2;
        const IfcFloat inner_height = ishape->OverallDepth - ishape->FlangeThickness * 2;

        meshout.mVerts.reserve(12);
        meshout.mVerts.push_back(IfcVector3(0,0,0));
        meshout.mVerts.push_back(IfcVector3(0,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(offset,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(offset,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(0,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(0,ishape->OverallDepth,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,ishape->OverallDepth,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(offset+ishape->WebThickness,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(offset+ishape->WebThickness,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,0,0));

        meshout.mVertcnt.push_back(12);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcParameterizedProfileDef entity, type is " + def.GetClassName());
        return;
    }

    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, *def.Position);
    meshout.Transform(trafo);
}